

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,unsigned_long>
          (BaseAppender *this,Vector *col,long input)

{
  bool bVar1;
  undefined1 auVar2 [16];
  unsigned_long result;
  uint64_t local_48;
  string local_40;
  
  bVar1 = TryCast::Operation<long,unsigned_long>(input,&local_48,false);
  if (bVar1) {
    *(uint64_t *)(col->data + (this->chunk).count * 8) = local_48;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,unsigned_long>(&local_40,(duckdb *)input,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_40);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}